

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq2d.cpp
# Opt level: O2

int __thiscall TPZGraphElQ2d::NPoints(TPZGraphElQ2d *this,TPZGraphNode *n)

{
  uint uVar1;
  byte bVar2;
  
  uVar1 = TPZGraphEl::ConnectNum(&this->super_TPZGraphEl,n);
  if (uVar1 < 4) {
    uVar1 = 1;
  }
  else {
    bVar2 = (byte)((this->super_TPZGraphEl).fGraphMesh)->fResolution;
    if (uVar1 - 4 < 4) {
      uVar1 = ~(-1 << (bVar2 & 0x1f));
    }
    else if (uVar1 == 8) {
      uVar1 = ~(-1 << (bVar2 & 0x1f));
      uVar1 = uVar1 * uVar1;
    }
    else {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

int TPZGraphElQ2d::NPoints(TPZGraphNode *n)
{
	int in = ConnectNum(n);
	int res = fGraphMesh->Res();
	switch(in)
	{
		case 0:
		case 1:
		case 2:
		case 3:
			return(1);
		case 4:
		case 5:
		case 6:
		case 7:
			return((1 << res)-1);
		case 8:
		{
			int a = ((1 << res)-1);
			return(a*a);
		}
	};
	return(0);
}